

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

void __thiscall ArgsManager::AddCommand(ArgsManager *this,string *cmd,string *help)

{
  size_type sVar1;
  const_reference pvVar2;
  mapped_type *func;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>
  assertion;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_bool>
  pVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
  *arg_map;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>,_bool>
  ret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  Arg *in_stack_fffffffffffffec8;
  Arg *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>
  *in_stack_fffffffffffffee8;
  map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
  *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  int line;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff00;
  char *file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 in_stack_ffffffffffffff18;
  char *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_79;
  char local_50 [64];
  undefined4 local_10;
  long local_8;
  
  line = (int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,
                     (char)((ulong)in_stack_ffffffffffffff18 >> 0x38),
                     (size_type)in_stack_ffffffffffffff08);
  local_79._M_string_length._0_1_ = sVar1 == 0xffffffffffffffff;
  this_01 = "AddCommand";
  inline_assertion_check<true,bool>
            ((bool *)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(char *)in_stack_fffffffffffffef0,
             (char *)in_stack_fffffffffffffee8);
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0);
  local_79._M_dataplus._M_p._7_1_ = *pvVar2 != '-';
  inline_assertion_check<true,bool>
            ((bool *)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(char *)in_stack_fffffffffffffef0,
             (char *)in_stack_fffffffffffffee8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffec8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
             (char *)in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffee8 >> 0x18,0));
  *(undefined1 *)(in_RDI + 0x180) = 0;
  local_79._M_dataplus._M_p._1_4_ = 0xb;
  func = std::
         map<OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>,_std::less<OptionsCategory>,_std::allocator<std::pair<const_OptionsCategory,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgsManager::Arg>_>_>_>_>_>
         ::operator[](in_stack_fffffffffffffef0,(key_type *)in_stack_fffffffffffffee8);
  file = local_50;
  __str = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)this_00,(allocator<char> *)__str);
  std::__cxx11::string::string(this_00,__str);
  local_10 = 0x800;
  pVar3 = std::
          map<std::__cxx11::string,ArgsManager::Arg,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgsManager::Arg>>>
          ::emplace<std::__cxx11::string_const&,ArgsManager::Arg>
                    (in_stack_fffffffffffffee8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffed8);
  assertion = pVar3.first._M_node;
  local_79.field_2._M_local_buf[1] = pVar3.second;
  local_79._9_8_ = assertion._M_node;
  Arg::~Arg(in_stack_fffffffffffffec8);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  inline_assertion_check<true,bool&>((bool *)__str,file,line,(char *)func,(char *)assertion._M_node)
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::AddCommand(const std::string& cmd, const std::string& help)
{
    Assert(cmd.find('=') == std::string::npos);
    Assert(cmd.at(0) != '-');

    LOCK(cs_args);
    m_accept_any_command = false; // latch to false
    std::map<std::string, Arg>& arg_map = m_available_args[OptionsCategory::COMMANDS];
    auto ret = arg_map.emplace(cmd, Arg{"", help, ArgsManager::COMMAND});
    Assert(ret.second); // Fail on duplicate commands
}